

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O2

string * __thiscall
vkt::drawutil::getPrimitiveTopologyShortName_abi_cxx11_
          (string *__return_storage_ptr__,drawutil *this,VkPrimitiveTopology topology)

{
  char *__s;
  string local_50;
  string name;
  
  __s = ::vk::getPrimitiveTopologyName((VkPrimitiveTopology)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,__s,(allocator<char> *)&local_50);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&name);
  de::toLower(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrimitiveTopologyShortName (const VkPrimitiveTopology topology)
{
	std::string name(getPrimitiveTopologyName(topology));
	return de::toLower(name.substr(22));
}